

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_lan.c
# Opt level: O1

olsrv2_lan_entry *
olsrv2_lan_add(nhdp_domain *domain,os_route_key *prefix,uint32_t metric,uint8_t distance)

{
  int iVar1;
  avl_node *paVar2;
  void *pvVar3;
  avl_node *paVar4;
  olsrv2_lan_entry *poVar5;
  long lVar6;
  char cVar7;
  
  paVar4 = avl_find(&_lan_tree,prefix);
  poVar5 = (olsrv2_lan_entry *)&paVar4[-1].parent;
  if (paVar4 == (avl_node *)0x0) {
    poVar5 = (olsrv2_lan_entry *)oonf_class_malloc(&_lan_class);
    if (poVar5 == (olsrv2_lan_entry *)0x0) {
      return (olsrv2_lan_entry *)0x0;
    }
    *(undefined4 *)((poVar5->prefix).src._addr + 0xe) = *(undefined4 *)((prefix->src)._addr + 0xe);
    paVar4 = *(avl_node **)(prefix->dst)._addr;
    paVar2 = *(avl_node **)((prefix->dst)._addr + 8);
    pvVar3 = *(void **)((prefix->src)._addr + 6);
    *(avl_node **)&(poVar5->prefix).dst._type = *(avl_node **)&(prefix->dst)._type;
    *(void **)((poVar5->prefix).src._addr + 6) = pvVar3;
    *(avl_node **)(poVar5->prefix).dst._addr = paVar4;
    *(avl_node **)((long)(poVar5->prefix).dst._addr + 8) = paVar2;
    (poVar5->_node).key = poVar5;
    avl_insert(&_lan_tree,&poVar5->_node);
    poVar5->same_distance = true;
    lVar6 = 100;
    do {
      *(undefined4 *)((long)(poVar5->prefix).dst._addr + lVar6) = 0xffffff;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x84);
  }
  iVar1 = domain->index;
  poVar5->_domaindata[iVar1].outgoing_metric = metric;
  poVar5->_domaindata[iVar1].distance = distance;
  poVar5->_domaindata[iVar1].active = true;
  olsrv2_routing_domain_changed(domain,true);
  poVar5->same_distance = true;
  lVar6 = 0xd;
  cVar7 = '\0';
  do {
    if (*(char *)((long)(poVar5->prefix).dst._addr + lVar6 * 8 + 1) == '\x01') {
      if (cVar7 == '\0') {
        cVar7 = *(char *)((long)(poVar5->prefix).dst._addr + lVar6 * 8);
      }
      if (cVar7 != *(char *)((long)(poVar5->prefix).dst._addr + lVar6 * 8)) {
        poVar5->same_distance = false;
        return poVar5;
      }
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x11) {
      return poVar5;
    }
  } while( true );
}

Assistant:

struct olsrv2_lan_entry *
olsrv2_lan_add(struct nhdp_domain *domain, const struct os_route_key *prefix, uint32_t metric, uint8_t distance) {
  struct olsrv2_lan_entry *entry;
  struct olsrv2_lan_domaindata *lan_data;
  uint8_t tmp_dist;
  int i;

  entry = olsrv2_lan_get(prefix);
  if (entry == NULL) {
    entry = oonf_class_malloc(&_lan_class);
    if (entry == NULL) {
      return NULL;
    }

    /* copy key and append to tree */
    memcpy(&entry->prefix, prefix, sizeof(*prefix));
    entry->_node.key = &entry->prefix;
    avl_insert(&_lan_tree, &entry->_node);

    entry->same_distance = true;

    /* initialize linkcost */
    for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
      entry->_domaindata[i].outgoing_metric = RFC7181_METRIC_INFINITE;
    }
  }

  lan_data = olsrv2_lan_get_domaindata(domain, entry);
  lan_data->outgoing_metric = metric;
  lan_data->distance = distance;
  lan_data->active = true;
  olsrv2_routing_domain_changed(domain, true);

  tmp_dist = 0;
  entry->same_distance = true;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    lan_data = &entry->_domaindata[i];
    if (lan_data->active) {
      if (tmp_dist == 0) {
        /* copy first valid distance */
        tmp_dist = lan_data->distance;
      }
      if (tmp_dist != lan_data->distance) {
        /* we found a difference */
        entry->same_distance = false;
        break;
      }
    }
  }
  return entry;
}